

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O3

Matrix * __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::interaction_matrix
          (Matrix *__return_storage_ptr__,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict> *this)

{
  Quadratic<unsigned_int,_double> *this_00;
  size_type sVar1;
  long lVar2;
  pointer puVar3;
  ulong uVar4;
  const_iterator cVar5;
  ulong uVar6;
  const_iterator cVar7;
  ulong uVar8;
  key_type *__k;
  double dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  long local_60;
  key_type local_58;
  key_type local_50;
  undefined8 local_48;
  size_type local_40;
  ulong local_38;
  
  get_variables(&local_78,this);
  sVar1 = (this->m_linear)._M_h._M_element_count;
  local_58 = (key_type)(sVar1 + 1);
  local_48 = 0;
  local_50 = local_58;
  if ((long)local_58 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)&local_58);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &this->m_quadratic;
    local_60 = 0;
    uVar4 = 0;
    local_40 = sVar1;
    do {
      sVar1 = local_40;
      __k = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + uVar4;
      cVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,__k);
      if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>._M_cur ==
          (__node_type *)0x0) {
        dVar9 = 0.0;
      }
      else {
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,__k);
        if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>._M_cur ==
            (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        dVar9 = *(double *)
                 ((long)cVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>.
                        _M_cur + 0x10);
      }
      if ((((long)sVar1 < 0) ||
          ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           ).m_storage.m_rows <= (long)uVar4)) ||
         (lVar2 = (__return_storage_ptr__->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
         , lVar2 <= (long)sVar1)) {
LAB_0015f251:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
      m_storage.m_data[lVar2 * uVar4 + sVar1] = dVar9;
      uVar8 = uVar4 + 1;
      uVar6 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2;
      local_38 = uVar8;
      if (uVar8 < uVar6) {
        do {
          puVar3 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_58.second =
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
          local_58.first = *__k;
          cVar7 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_58);
          if (cVar7.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
              ._M_cur == (__node_type *)0x0) {
            dVar9 = 0.0;
          }
          else {
            local_58.second = puVar3[uVar8];
            local_58.first = *__k;
            cVar7 = std::
                    _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this_00->_M_h,&local_58);
            if (cVar7.
                super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            dVar9 = *(double *)
                     ((long)cVar7.
                            super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                            ._M_cur + 0x10) + 0.0;
          }
          local_58.second = *__k;
          local_58.first = puVar3[uVar8];
          cVar7 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_58);
          if (cVar7.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
              ._M_cur != (__node_type *)0x0) {
            local_58.second = *__k;
            local_58.first = puVar3[uVar8];
            cVar7 = std::
                    _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this_00->_M_h,&local_58);
            if (cVar7.
                super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            dVar9 = dVar9 + *(double *)
                             ((long)cVar7.
                                    super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                                    ._M_cur + 0x10);
          }
          if (((__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows <=
               (long)uVar4) ||
             (lVar2 = (__return_storage_ptr__->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                      m_cols, lVar2 <= (long)uVar8)) goto LAB_0015f251;
          *(double *)
           ((long)(__return_storage_ptr__->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data
           + uVar8 * 8 + lVar2 * local_60) = dVar9;
          uVar8 = uVar8 + 1;
          uVar6 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2;
        } while (uVar8 < uVar6);
      }
      local_60 = local_60 + 8;
      uVar4 = local_38;
    } while (local_38 < uVar6);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix interaction_matrix() const {
      // generate matrix
      auto indices = this->get_variables();
      size_t system_size = this->get_num_variables();
      Matrix _interaction_matrix = Matrix::Zero( system_size + 1, system_size + 1 );
      const Linear<IndexType, FloatType> &linear = m_linear;
      const Quadratic<IndexType, FloatType> &quadratic = m_quadratic;

      for ( size_t i = 0; i < indices.size(); i++ ) {
        const IndexType &i_index = indices[ i ];
        _interaction_matrix( i, system_size ) = ( linear.find( i_index ) != linear.end() ) ? linear.at( i_index ) : 0;
        for ( size_t j = i + 1; j < indices.size(); j++ ) {
          const IndexType &j_index = indices[ j ];
          FloatType jval = 0.0;

          if ( quadratic.find( std::make_pair( i_index, j_index ) ) != quadratic.end() ) {
            jval += quadratic.at( std::make_pair( i_index, j_index ) );
          }
          if ( quadratic.find( std::make_pair( j_index, i_index ) ) != quadratic.end() ) {
            jval += quadratic.at( std::make_pair( j_index, i_index ) );
          }

          _interaction_matrix( i, j ) = jval;
        }
      }

      return _interaction_matrix;
    }